

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffiimgll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  int iVar1;
  long nblock;
  char local_178 [8];
  char naxiskey [75];
  char card [81];
  char local_c8 [8];
  char errmsg [81];
  LONGLONG datasize;
  LONGLONG newstart;
  LONGLONG npixels;
  long nblocks;
  int local_40;
  int onaxis;
  int ii;
  int maxhdu;
  int nexthdu;
  int bytlen;
  int *status_local;
  LONGLONG *naxes_local;
  int naxis_local;
  int bitpix_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    _nexthdu = status;
    status_local = (int *)naxes;
    naxes_local._0_4_ = naxis;
    naxes_local._4_4_ = bitpix;
    _naxis_local = fptr;
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    onaxis = _naxis_local->Fptr->maxhdu;
    if ((*_nexthdu == -9) ||
       ((_naxis_local->Fptr->headend != _naxis_local->Fptr->headstart[_naxis_local->Fptr->curhdu] &&
        ((_naxis_local->Fptr->curhdu != onaxis ||
         (_naxis_local->Fptr->headstart[onaxis + 1] < _naxis_local->Fptr->logfilesize)))))) {
      if (naxes_local._4_4_ == 8) {
        maxhdu = 1;
      }
      else if (naxes_local._4_4_ == 0x10) {
        maxhdu = 2;
      }
      else if ((naxes_local._4_4_ == 0x20) || (naxes_local._4_4_ == 0xffffffe0)) {
        maxhdu = 4;
      }
      else {
        if ((naxes_local._4_4_ != 0x40) && (naxes_local._4_4_ != 0xffffffc0)) {
          snprintf(local_c8,0x51,"Illegal value for BITPIX keyword: %d",(ulong)naxes_local._4_4_);
          ffpmsg(local_c8);
          *_nexthdu = 0xd3;
          return 0xd3;
        }
        maxhdu = 8;
      }
      if (((int)(uint)naxes_local < 0) || (999 < (int)(uint)naxes_local)) {
        snprintf(local_c8,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxes_local);
        ffpmsg(local_c8);
        *_nexthdu = 0xd4;
        fptr_local._4_4_ = 0xd4;
      }
      else {
        for (local_40 = 0; local_40 < (int)(uint)naxes_local; local_40 = local_40 + 1) {
          if (*(long *)(status_local + (long)local_40 * 2) < 0) {
            snprintf(local_c8,0x51,"Illegal value for NAXIS%d keyword: %ld",(ulong)(local_40 + 1),
                     *(undefined8 *)(status_local + (long)local_40 * 2));
            ffpmsg(local_c8);
            *_nexthdu = 0xd5;
            return 0xd5;
          }
        }
        if ((uint)naxes_local == 0) {
          newstart = 0;
        }
        else {
          newstart = *(LONGLONG *)status_local;
        }
        for (local_40 = 1; local_40 < (int)(uint)naxes_local; local_40 = local_40 + 1) {
          newstart = newstart * *(long *)(status_local + (long)local_40 * 2);
        }
        nblock = (newstart * maxhdu + 0xb3f) / 0xb40 + 1;
        if (_naxis_local->Fptr->writemode == 1) {
          ffrdef(_naxis_local,_nexthdu);
          ffpdfl(_naxis_local,_nexthdu);
          if (*_nexthdu == -9) {
            *_nexthdu = 0;
            ffmahd(_naxis_local,1,(int *)0x0,_nexthdu);
            ffgidm(_naxis_local,(int *)((long)&nblocks + 4),_nexthdu);
            if (nblocks._4_4_ < 1) {
              strcpy(local_178,"NAXIS");
            }
            else {
              ffkeyn("NAXIS",nblocks._4_4_,local_178,_nexthdu);
            }
            ffgcrd(_naxis_local,local_178,naxiskey + 0x48,_nexthdu);
            ffikyj(_naxis_local,"PCOUNT",0,"required keyword",_nexthdu);
            ffikyj(_naxis_local,"GCOUNT",1,"required keyword",_nexthdu);
            if (0 < *_nexthdu) {
              return *_nexthdu;
            }
            iVar1 = ffdkey(_naxis_local,"EXTEND",_nexthdu);
            if (iVar1 != 0) {
              *_nexthdu = 0;
            }
            ffrdef(_naxis_local,_nexthdu);
            iVar1 = ffiblk(_naxis_local,nblock,-1,_nexthdu);
            if (0 < iVar1) {
              return *_nexthdu;
            }
            ii = 0;
            datasize = 0;
          }
          else {
            ii = _naxis_local->Fptr->curhdu + 1;
            datasize = _naxis_local->Fptr->headstart[ii];
            _naxis_local->Fptr->hdutype = 0;
            iVar1 = ffiblk(_naxis_local,nblock,1,_nexthdu);
            if (0 < iVar1) {
              return *_nexthdu;
            }
          }
          _naxis_local->Fptr->maxhdu = _naxis_local->Fptr->maxhdu + 1;
          for (local_40 = _naxis_local->Fptr->maxhdu; _naxis_local->Fptr->curhdu < local_40;
              local_40 = local_40 + -1) {
            _naxis_local->Fptr->headstart[local_40 + 1] = _naxis_local->Fptr->headstart[local_40];
          }
          if (ii == 0) {
            _naxis_local->Fptr->headstart[1] = nblock * 0xb40;
          }
          _naxis_local->Fptr->headstart[ii] = datasize;
          _naxis_local->Fptr->curhdu = ii;
          _naxis_local->HDUposition = ii;
          _naxis_local->Fptr->nextkey = _naxis_local->Fptr->headstart[ii];
          _naxis_local->Fptr->headend = _naxis_local->Fptr->headstart[ii];
          _naxis_local->Fptr->datastart = _naxis_local->Fptr->headstart[ii] + 0xb40;
          _naxis_local->Fptr->hdutype = 0;
          ffphprll(_naxis_local,1,naxes_local._4_4_,(uint)naxes_local,(LONGLONG *)status_local,0,1,1
                   ,_nexthdu);
          ffrdef(_naxis_local,_nexthdu);
          fptr_local._4_4_ = *_nexthdu;
        }
        else {
          *_nexthdu = 0x70;
          fptr_local._4_4_ = 0x70;
        }
      }
    }
    else {
      ffcrimll(_naxis_local,naxes_local._4_4_,(uint)naxes_local,(LONGLONG *)status_local,_nexthdu);
      fptr_local._4_4_ = *_nexthdu;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffiimgll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  insert an IMAGE extension following the current HDU 
*/
{
    int bytlen, nexthdu, maxhdu, ii, onaxis;
    long nblocks;
    LONGLONG npixels, newstart, datasize;
    char errmsg[FLEN_ERRMSG], card[FLEN_CARD], naxiskey[FLEN_KEYWORD];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;

    if (*status != PREPEND_PRIMARY)
    {
      /* if the current header is completely empty ...  */
      if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])
        /* or, if we are at the end of the file, ... */
      ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
      {
        /* then simply append new image extension */
        ffcrimll(fptr, bitpix, naxis, naxes, status);
        return(*status);
      }
    }

    if (bitpix == 8)
        bytlen = 1;
    else if (bitpix == 16)
        bytlen = 2;
    else if (bitpix == 32 || bitpix == -32)
        bytlen = 4;
    else if (bitpix == 64 || bitpix == -64)
        bytlen = 8;
    else
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(errmsg);
        return(*status = BAD_BITPIX);  /* illegal bitpix value */
    }
    if (naxis < 0 || naxis > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(errmsg);
        return(*status = BAD_NAXIS);
    }

    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(errmsg, FLEN_ERRMSG,
            "Illegal value for NAXIS%d keyword: %ld", ii + 1,  (long) naxes[ii]);
            ffpmsg(errmsg);
            return(*status = BAD_NAXES);
        }
    }

    /* calculate number of pixels in the image */
    if (naxis == 0)
        npixels = 0;
    else 
        npixels = naxes[0];

    for (ii = 1; ii < naxis; ii++)
        npixels = npixels * naxes[ii];

    datasize = npixels * bytlen;          /* size of image in bytes */
    nblocks = (long) (((datasize + 2879) / 2880) + 1);  /* +1 for the header */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    if (*status == PREPEND_PRIMARY)
    {
        /* inserting a new primary array; the current primary */
        /* array must be transformed into an image extension. */

        *status = 0;   
        ffmahd(fptr, 1, NULL, status);  /* move to the primary array */

        ffgidm(fptr, &onaxis, status);
        if (onaxis > 0)
            ffkeyn("NAXIS",onaxis, naxiskey, status);
        else
            strcpy(naxiskey, "NAXIS");

        ffgcrd(fptr, naxiskey, card, status);  /* read last NAXIS keyword */
        
        ffikyj(fptr, "PCOUNT", 0, "required keyword", status); /* add PCOUNT and */
        ffikyj(fptr, "GCOUNT", 1, "required keyword", status); /* GCOUNT keywords */

        if (*status > 0)
            return(*status);

        if (ffdkey(fptr, "EXTEND", status) ) /* delete the EXTEND keyword */
            *status = 0;

        /* redefine internal structure for this HDU */
        ffrdef(fptr, status);


        /* insert space for the primary array */
        if (ffiblk(fptr, nblocks, -1, status) > 0)  /* insert the blocks */
            return(*status);

        nexthdu = 0;  /* number of the new hdu */
        newstart = 0; /* starting addr of HDU */
    }
    else
    {
        nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
        newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

        (fptr->Fptr)->hdutype = IMAGE_HDU;  /* so that correct fill value is used */
        /* ffiblk also increments headstart for all following HDUs */
        if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
            return(*status);
    }

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    if (nexthdu == 0)
       (fptr->Fptr)->headstart[1] = nblocks * 2880; /* start of the old Primary array */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + 2880;
    (fptr->Fptr)->hdutype = IMAGE_HDU;  /* might need to be reset... */

    /* write the required header keywords */
    ffphprll(fptr, TRUE, bitpix, naxis, naxes, 0, 1, TRUE, status);

    /* redefine internal structure for this HDU */
    ffrdef(fptr, status);
    return(*status);
}